

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void wand_explode(obj *obj)

{
  int n;
  char *pcVar1;
  obj *obj_local;
  
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xff7fffff | 0x800000;
  pcVar1 = xname(obj);
  pline("Your %s vibrates violently, and explodes!",pcVar1);
  n = rnd(((u.uhpmax + 1) * 2) / 3);
  losehp(n,"exploding wand",0);
  useup(obj);
  exercise(0,'\0');
  return;
}

Assistant:

static void wand_explode(struct obj *obj)
{
    obj->in_use = TRUE;	/* in case losehp() is fatal */
    pline("Your %s vibrates violently, and explodes!",xname(obj));
    losehp(rnd(2*(u.uhpmax+1)/3), "exploding wand", KILLED_BY_AN);
    useup(obj);
    exercise(A_STR, FALSE);
}